

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_mail_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  CURLcode local_1c;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  if (smtpcode / 100 == 2) {
    local_1c = smtp_perform_rcpt_to(data);
  }
  else {
    Curl_failf(data,"MAIL failed: %d",(ulong)(uint)smtpcode);
    local_1c = CURLE_SEND_ERROR;
  }
  return local_1c;
}

Assistant:

static CURLcode smtp_state_mail_resp(struct Curl_easy *data, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2) {
    failf(data, "MAIL failed: %d", smtpcode);
    result = CURLE_SEND_ERROR;
  }
  else
    /* Start the RCPT TO command */
    result = smtp_perform_rcpt_to(data);

  return result;
}